

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copy.c
# Opt level: O1

upb_Array *
upb_Array_DeepClone(upb_Array *array,upb_CType value_type,upb_MiniTable *sub,upb_Arena *arena)

{
  byte bVar1;
  ulong min_capacity;
  _Bool _Var2;
  upb_Array *array_00;
  size_t i;
  ulong size;
  upb_MessageValue val;
  upb_MessageValue local_48;
  upb_MiniTable *local_38;
  
  min_capacity = array->size_dont_copy_me__upb_internal_use_only;
  bVar1 = _upb_CType_SizeLg2_dont_copy_me__upb_internal_use_only_size[value_type - kUpb_CType_Bool];
  size = (min_capacity << (bVar1 & 0x3f)) + 0x1f & 0xfffffffffffffff8;
  array_00 = (upb_Array *)arena->ptr_dont_copy_me__upb_internal_use_only;
  local_38 = sub;
  if ((ulong)((long)arena->end_dont_copy_me__upb_internal_use_only - (long)array_00) < size) {
    array_00 = (upb_Array *)_upb_Arena_SlowMalloc_dont_copy_me__upb_internal_use_only(arena,size);
  }
  else {
    if ((upb_Array *)
        ((ulong)((long)&array_00->data_dont_copy_me__upb_internal_use_only + 7U) &
        0xfffffffffffffff8) != array_00) {
      __assert_fail("((((uintptr_t)ret) + (8) - 1) / (8) * (8)) == (uintptr_t)ret",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mem/internal/arena.h"
                    ,0x3b,"void *upb_Arena_Malloc(struct upb_Arena *, size_t)");
    }
    arena->ptr_dont_copy_me__upb_internal_use_only =
         (char *)((long)&array_00->data_dont_copy_me__upb_internal_use_only + size);
  }
  if (array_00 == (upb_Array *)0x0) {
    array_00 = (upb_Array *)0x0;
  }
  else {
    array_00->data_dont_copy_me__upb_internal_use_only =
         (((long)(char)bVar1 & 0xffffffffU) - 1) + (ulong)(value_type - kUpb_CType_Bool == 0) |
         (ulong)(array_00 + 1);
    array_00->size_dont_copy_me__upb_internal_use_only = 0;
    array_00->capacity_dont_copy_me__upb_internal_use_only = min_capacity;
  }
  if (array_00 != (upb_Array *)0x0) {
    if ((array_00->data_dont_copy_me__upb_internal_use_only & 4) != 0) {
      __assert_fail("!upb_Array_IsFrozen(array)",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/internal/array.h"
                    ,0x6c,
                    "_Bool _upb_Array_ResizeUninitialized_dont_copy_me__upb_internal_use_only(struct upb_Array *, size_t, upb_Arena *)"
                   );
    }
    if ((min_capacity <= array_00->capacity_dont_copy_me__upb_internal_use_only) ||
       (_Var2 = _upb_Array_Realloc_dont_copy_me__upb_internal_use_only(array_00,min_capacity,arena),
       _Var2)) {
      array_00->size_dont_copy_me__upb_internal_use_only = min_capacity;
      if (min_capacity == 0) {
        return array_00;
      }
      i = 0;
      while( true ) {
        local_48 = upb_Array_Get(array,i);
        _Var2 = upb_Clone_MessageValue(&local_48,value_type,local_38,arena);
        if (!_Var2) break;
        upb_Array_Set(array_00,i,local_48);
        i = i + 1;
        if (min_capacity == i) {
          return array_00;
        }
      }
    }
  }
  return (upb_Array *)0x0;
}

Assistant:

upb_Array* upb_Array_DeepClone(const upb_Array* array, upb_CType value_type,
                               const upb_MiniTable* sub, upb_Arena* arena) {
  const size_t size = upb_Array_Size(array);
  const int lg2 = UPB_PRIVATE(_upb_CType_SizeLg2)(value_type);
  upb_Array* cloned_array = UPB_PRIVATE(_upb_Array_New)(arena, size, lg2);
  if (!cloned_array) {
    return NULL;
  }
  if (!UPB_PRIVATE(_upb_Array_ResizeUninitialized)(cloned_array, size, arena)) {
    return NULL;
  }
  for (size_t i = 0; i < size; ++i) {
    upb_MessageValue val = upb_Array_Get(array, i);
    if (!upb_Clone_MessageValue(&val, value_type, sub, arena)) {
      return NULL;
    }
    upb_Array_Set(cloned_array, i, val);
  }
  return cloned_array;
}